

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

CommandLineOption ** __thiscall
List<CommandLineOption_*>::find
          (List<CommandLineOption_*> *this,function<bool_(CommandLineOption_*const_&)> *func)

{
  function<bool_(CommandLineOption_*const_&)> *pfVar1;
  bool bVar2;
  CommandLineOption **extraout_RAX;
  CommandLineOption **ppCVar3;
  function<bool_(CommandLineOption_*const_&)> *pfVar4;
  function<bool_(CommandLineOption_*const_&)> *raw_args;
  _Map_pointer pppCVar5;
  function<bool_(CommandLineOption_*const_&)> *pfVar6;
  allocator aStack_79;
  String SStack_78;
  CommandLineOption **appCStack_58 [2];
  CommandLineOption *apCStack_48 [2];
  function<bool_(CommandLineOption_*const_&)> *pfStack_38;
  function<bool_(CommandLineOption_*const_&)> *pfStack_30;
  
  pfVar4 = (function<bool_(CommandLineOption_*const_&)> *)
           (this->_deque).
           super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pfVar1 = (function<bool_(CommandLineOption_*const_&)> *)
           (this->_deque).
           super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pfVar4 != pfVar1) {
    pfVar6 = (function<bool_(CommandLineOption_*const_&)> *)
             (this->_deque).
             super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    pppCVar5 = (this->_deque).
               super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    raw_args = func;
    do {
      if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
        pfStack_30 = (function<bool_(CommandLineOption_*const_&)> *)error<char>;
        std::__throw_bad_function_call();
        pfStack_38 = pfVar4;
        pfStack_30 = func;
        std::__cxx11::string::string((string *)appCStack_58,(char *)this,&aStack_79);
        format<char>(&SStack_78,(String *)appCStack_58,(char *)raw_args);
        error(&SStack_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)SStack_78._string._M_dataplus._M_p != &SStack_78._string.field_2) {
          operator_delete(SStack_78._string._M_dataplus._M_p);
        }
        ppCVar3 = apCStack_48;
        if (appCStack_58[0] != ppCVar3) {
          operator_delete(appCStack_58[0]);
          ppCVar3 = extraout_RAX;
        }
        return ppCVar3;
      }
      pfStack_30 = (function<bool_(CommandLineOption_*const_&)> *)0x111910;
      raw_args = pfVar4;
      this = (List<CommandLineOption_*> *)func;
      bVar2 = (*func->_M_invoker)((_Any_data *)func,(CommandLineOption **)pfVar4);
      if (bVar2) {
        return (CommandLineOption **)pfVar4;
      }
      pfVar4 = (function<bool_(CommandLineOption_*const_&)> *)
               ((long)&(pfVar4->super__Function_base)._M_functor + 8);
      if (pfVar4 == pfVar6) {
        pfVar4 = (function<bool_(CommandLineOption_*const_&)> *)pppCVar5[1];
        pppCVar5 = pppCVar5 + 1;
        pfVar6 = pfVar4 + 0x10;
      }
    } while (pfVar4 != pfVar1);
  }
  return (CommandLineOption **)0x0;
}

Assistant:

void List<T>::removeAt (int pos)
{
	ASSERT_LT (pos, size());
	_deque.erase (_deque.begin() + pos);
}